

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall CP::queue<int>::queue(queue<int> *this,queue<int> *a)

{
  undefined1 auVar1 [16];
  ulong __n;
  int *__s;
  ulong local_20;
  size_t i;
  queue<int> *a_local;
  queue<int> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a->mCap;
  __n = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->mData = __s;
  this->mCap = a->mCap;
  this->mSize = a->mSize;
  for (local_20 = 0; local_20 < a->mCap; local_20 = local_20 + 1) {
    this->mData[local_20] = a->mData[local_20];
  }
  this->mFront = a->mFront;
  return;
}

Assistant:

queue(const queue<T>& a) {
      this->mData = new T[a.mCap]();
      this->mCap = a.mCap;
      this->mSize = a.mSize;
      for (size_t i = 0; i < a.mCap;i++) {
        mData[i] = a.mData[i];
      }
      this->mFront = a.mFront;
    }